

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

int __thiscall ON_Brep::RemoveWireVertices(ON_Brep *this)

{
  int iVar1;
  int iVar2;
  ON_BrepVertex *pOVar3;
  int local_18;
  int count;
  int vi;
  int rc;
  ON_Brep *this_local;
  
  count = 0;
  iVar1 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    pOVar3 = ON_ClassArray<ON_BrepVertex>::operator[]
                       ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,local_18);
    if (local_18 == pOVar3->m_vertex_index) {
      pOVar3 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,local_18);
      iVar2 = ON_SimpleArray<int>::Count(&pOVar3->m_ei);
      if (iVar2 == 0) {
        count = count + 1;
        pOVar3 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,local_18);
        DeleteVertex(this,pOVar3);
      }
    }
  }
  return count;
}

Assistant:

int ON_Brep::RemoveWireVertices()
{
  int rc = 0;
  int vi, count = m_V.Count();
  for ( vi = 0; vi < count; vi++ )
  {
    if ( vi == m_V[vi].m_vertex_index && 0 == m_V[vi].m_ei.Count() )
    {
      rc++;
      DeleteVertex( m_V[vi] );
    }
  }
  return rc;
}